

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_shift_new_globals(REF_NODE ref_node)

{
  REF_MPI ref_mpi;
  long lVar1;
  uint uVar2;
  void *array;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long shift;
  REF_INT new_nodes;
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x2d9,
           "ref_node_shift_new_globals","malloc everyones_new_nodes of REF_INT negative");
    uVar2 = 1;
  }
  else {
    array = malloc((long)ref_mpi->n << 2);
    if (array == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x2d9,
             "ref_node_shift_new_globals","malloc everyones_new_nodes of REF_INT NULL");
      uVar2 = 2;
    }
    else {
      new_nodes = (int)ref_node->new_n_global - (int)ref_node->old_n_global;
      uVar2 = ref_mpi_allgather(ref_mpi,&new_nodes,array,1);
      if (uVar2 == 0) {
        uVar4 = 0;
        uVar3 = (ulong)(uint)ref_mpi->id;
        if (ref_mpi->id < 1) {
          uVar3 = uVar4;
        }
        shift = 0;
        for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          shift = shift + *(int *)((long)array + uVar4 * 4);
        }
        uVar4 = 0;
        uVar3 = (ulong)(uint)ref_mpi->n;
        if (ref_mpi->n < 1) {
          uVar3 = uVar4;
        }
        lVar5 = 0;
        for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          lVar5 = lVar5 + *(int *)((long)array + uVar4 * 4);
        }
        free(array);
        if (shift != 0) {
          uVar4 = 0;
          uVar3 = (ulong)(uint)ref_node->max;
          if (ref_node->max < 1) {
            uVar3 = uVar4;
          }
          for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
            lVar1 = ref_node->global[uVar4];
            if ((-1 < lVar1) && (ref_node->old_n_global <= lVar1)) {
              ref_node->global[uVar4] = lVar1 + shift;
            }
          }
          for (uVar3 = (ulong)(uint)ref_node->n; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
            lVar1 = ref_node->sorted_global[uVar3 - 1];
            if (lVar1 < ref_node->old_n_global) break;
            ref_node->sorted_global[uVar3 - 1] = lVar1 + shift;
          }
          ref_node_shift_unused(ref_node,ref_node->old_n_global,shift);
        }
        lVar5 = lVar5 + ref_node->old_n_global;
        ref_node->old_n_global = lVar5;
        ref_node->new_n_global = lVar5;
        uVar2 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x2de,"ref_node_shift_new_globals",(ulong)uVar2,"allgather");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_shift_new_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT new_nodes;
  REF_INT *everyones_new_nodes;
  REF_GLOB offset, total_new_nodes;
  REF_INT proc, node;

  ref_malloc(everyones_new_nodes, ref_mpi_n(ref_mpi), REF_INT);

  new_nodes = (REF_INT)(ref_node->new_n_global - ref_node->old_n_global);

  RSS(ref_mpi_allgather(ref_mpi, &new_nodes, everyones_new_nodes, REF_INT_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += everyones_new_nodes[proc];
  }

  total_new_nodes = 0;
  each_ref_mpi_part(ref_mpi, proc) {
    total_new_nodes += everyones_new_nodes[proc];
  }

  ref_free(everyones_new_nodes);

  if (0 != offset) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_global(ref_node, node) >= ref_node->old_n_global) {
        (ref_node->global[node]) += offset;
      }
    }
    for (node = ref_node_n(ref_node) - 1;
         node >= 0 && ref_node->sorted_global[node] >= ref_node->old_n_global;
         node--)
      ref_node->sorted_global[node] += offset;

    RSS(ref_node_shift_unused(ref_node, ref_node->old_n_global, offset),
        "shift");
  }

  RSS(ref_node_initialize_n_global(ref_node,
                                   total_new_nodes + ref_node->old_n_global),
      "re-init");

  return REF_SUCCESS;
}